

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O3

void __thiscall FFlatVertexBuffer::CreateFlatVBO(FFlatVertexBuffer *this)

{
  extsector_t *peVar1;
  F3DFloor **ppFVar2;
  F3DFloor *pFVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  sector_t *psVar7;
  ulong uVar8;
  uint h;
  sector_t *psVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  uint local_34;
  
  uVar6 = (ulong)(uint)numsectors;
  h = 0;
  lVar13 = 0xb0;
  bVar5 = true;
  do {
    bVar4 = bVar5;
    if (0 < (int)uVar6) {
      local_34 = h ^ 1;
      lVar14 = 0;
      lVar12 = 0;
      do {
        psVar7 = (sector_t *)((long)&sectors->planes[0].xform.xOffs + lVar14);
        CreateVertices(this,h,psVar7,(secplane_t *)((long)&psVar7->planes[0].xform.xOffs + lVar13),
                       local_34);
        lVar12 = lVar12 + 1;
        uVar6 = (ulong)numsectors;
        lVar14 = lVar14 + 0x268;
      } while (lVar12 < (long)uVar6);
    }
    psVar7 = sectors;
    h = 1;
    lVar13 = 0xd8;
    bVar5 = false;
  } while (bVar4);
  if (0 < (int)uVar6) {
    uVar8 = 0;
    do {
      peVar1 = psVar7[uVar8].e;
      uVar10 = (ulong)(peVar1->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
      if (uVar10 != 0) {
        ppFVar2 = (peVar1->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
        psVar9 = psVar7 + uVar8;
        uVar11 = 0;
        do {
          pFVar3 = ppFVar2[uVar11];
          if ((pFVar3->top).model == psVar9) {
            (pFVar3->top).vindex = psVar9->vboindex[(pFVar3->top).isceiling];
          }
          if ((pFVar3->bottom).model == psVar9) {
            (pFVar3->bottom).vindex = psVar9->vboindex[(pFVar3->top).isceiling];
          }
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uVar6 & 0xffffffff));
  }
  return;
}

Assistant:

void FFlatVertexBuffer::CreateFlatVBO()
{
	for (int h = sector_t::floor; h <= sector_t::ceiling; h++)
	{
		for(int i=0; i<numsectors;i++)
		{
			CreateVertices(h, &sectors[i], sectors[i].GetSecPlane(h), h == sector_t::floor);
		}
	}

	// We need to do a final check for Vavoom water and FF_FIX sectors.
	// No new vertices are needed here. The planes come from the actual sector
	for(int i=0; i<numsectors;i++)
	{
		for(unsigned j=0;j<sectors[i].e->XFloor.ffloors.Size(); j++)
		{
			F3DFloor *ff = sectors[i].e->XFloor.ffloors[j];

			if (ff->top.model == &sectors[i])
			{
				ff->top.vindex = sectors[i].vboindex[ff->top.isceiling];
			}
			if (ff->bottom.model == &sectors[i])
			{
				ff->bottom.vindex = sectors[i].vboindex[ff->top.isceiling];
			}
		}
	}
}